

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::InfiniteLightSource::writeTo(InfiniteLightSource *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *in_RDX;
  
  BinaryWriter::write(binary,(int)this + 0x18,in_RDX,in_RCX);
  BinaryWriter::write<pbrt::math::affine3f>(binary,&this->transform);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->L);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->scale);
  BinaryWriter::write<int>(binary,&this->nSamples);
  return 0x46;
}

Assistant:

int InfiniteLightSource::writeTo(BinaryWriter &binary) 
  {
    binary.write(mapName);
    binary.write(transform);
    binary.write(L);
    binary.write(scale);
    binary.write(nSamples);
    return TYPE_INFINITE_LIGHT_SOURCE;
  }